

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

vector<BN,_std::allocator<BN>_> * __thiscall
BN::expBest_SlidePrecomp(vector<BN,_std::allocator<BN>_> *__return_storage_ptr__,BN *this,BN *mod)

{
  pointer puVar1;
  void *pvVar2;
  long lVar3;
  vector<BN,_std::allocator<BN>_> garr;
  BN mu;
  BN g;
  BN local_b8;
  vector<BN,_std::allocator<BN>_> local_98;
  BN local_78;
  BN local_60;
  BN local_48;
  
  std::vector<BN,_std::allocator<BN>_>::vector(&local_98,0x100,(allocator_type *)&local_60);
  anon_unknown.dwarf_2e466::reductionBarrettPrecomputation(&local_60,mod);
  reductionBarrett(&local_48,this,mod,&local_60);
  bn1();
  if (local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      != &local_b8) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
              (&(local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                 super__Vector_impl_data._M_start)->ba,&local_b8.ba);
  }
  if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      + 1 != &local_48) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
              (&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data
                ._M_start[1].ba,&local_48.ba);
  }
  Qrt(&local_78,&local_48);
  reductionBarrett(&local_b8,&local_78,mod,&local_60);
  if (local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      + 2 != &local_b8) {
    puVar1 = local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start[2].ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start[2]
    .ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start[2]
    .ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start[2]
    .ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
  }
  if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  lVar3 = 0;
  do {
    karatsubaMultiplication
              (&local_78,
               (BN *)((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                             super__Vector_impl_data._M_start[1].ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar3),
               local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start + 2);
    reductionBarrett(&local_b8,&local_78,mod,&local_60);
    if ((BN *)((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                      super__Vector_impl_data._M_start[3].ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar3) != &local_b8) {
      pvVar2 = *(void **)((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                                 super__Vector_impl_data._M_start[3].ba.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar3);
      *(pointer *)
       ((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start[3].ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar3) =
           local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start[3].ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_finish + lVar3) =
           local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start[3].ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + lVar3) =
           local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2);
      }
    }
    if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0x17d0);
  (__return_storage_ptr__->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
  ;
  (__return_storage_ptr__->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<BN,_std::allocator<BN>_>::~vector(&local_98);
  return __return_storage_ptr__;
}

Assistant:

vector<BN> BN::expBest_SlidePrecomp(const BN& mod) const {
    vector <BN> garr (KarySize);
    BN mu = reductionBarrettPrecomputation(mod);
    BN g = this -> reductionBarrett(mod, mu);
    garr[0] = BN::bn1();
    garr[1] = g;
    garr[2] = g.Qrt().reductionBarrett(mod,mu);
    for(bt2 i = 1; i < KarySize/ 2; i++)
        garr[2 * i + 1] = (garr[2 * i - 1] * garr[2]).reductionBarrett(mod,mu);
    return move(garr);

}